

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_set.c
# Opt level: O0

int mpt_color_pset(mpt_color *col,mpt_convertable *src)

{
  int iVar1;
  int take;
  int len;
  int type;
  char *txt;
  mpt_convertable *src_local;
  mpt_color *col_local;
  
  if (src == (mpt_convertable *)0x0) {
    col_local._4_4_ = (uint)(*col != (mpt_color)0xff);
  }
  else {
    txt = (char *)src;
    src_local = (mpt_convertable *)col;
    iVar1 = mpt_color_typeid();
    if ((iVar1 < 1) ||
       (iVar1 = (*(code *)**(undefined8 **)txt)(txt,(long)iVar1,src_local), iVar1 < 0)) {
      iVar1 = (*(code *)**(undefined8 **)txt)(txt,0x73,&len);
      if (iVar1 < 0) {
        col_local._4_4_ = 0xfffffffd;
      }
      else {
        iVar1 = mpt_color_parse((mpt_color *)src_local,_len);
        if (iVar1 < 0) {
          col_local._4_4_ = 0xfffffffe;
        }
        else {
          col_local._4_4_ = 0;
        }
      }
    }
    else {
      col_local._4_4_ = 0;
    }
  }
  return col_local._4_4_;
}

Assistant:

extern int mpt_color_pset(MPT_STRUCT(color) *col, MPT_INTERFACE(convertable) *src)
{
	const char *txt;
	int type;
	int len;
	
	if (!src) {
		/* default color is black, no transparency */
		static const MPT_STRUCT(color) tcol = MPT_COLOR_INIT;
		return memcmp(&tcol, col, sizeof(*col)) ? 1 : 0;
	}
	if ((type = mpt_color_typeid()) > 0
	 && (len = src->_vptr->convert(src, type, col)) >= 0) {
		return 0;
	}
	/* parse color name/format  */
	if ((len = src->_vptr->convert(src, 's', &txt)) >= 0) {
		int take;
		if ((take = mpt_color_parse(col, txt)) < 0) {
			return MPT_ERROR(BadValue);
		}
		return 0;
	}
	return MPT_ERROR(BadType);
}